

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

void __thiscall common_sampler::set_logits(common_sampler *this,llama_context *ctx,int idx)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  reference pvVar5;
  llama_token_data *plVar6;
  size_type sVar7;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  llama_token token_id;
  int n_vocab;
  llama_vocab *vocab;
  llama_model *model;
  float *logits;
  size_type in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb0;
  uint7 in_stack_ffffffffffffffb1;
  int local_38;
  
  lVar3 = llama_get_logits_ith(in_RSI,in_EDX);
  uVar4 = llama_get_model(in_RSI);
  uVar4 = llama_model_get_vocab(uVar4);
  iVar2 = llama_vocab_n_tokens(uVar4);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::resize
            ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)
             CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
    uVar1 = *(undefined4 *)(lVar3 + (long)local_38 * 4);
    pvVar5 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::operator[]
                       ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)
                        (in_RDI + 0x168),(long)local_38);
    pvVar5->id = local_38;
    pvVar5->logit = (float)uVar1;
    pvVar5->p = 0.0;
  }
  plVar6 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::data
                     ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x36c58c);
  sVar7 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::size
                    ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)(in_RDI + 0x168)
                    );
  *(llama_token_data **)(in_RDI + 0x180) = plVar6;
  *(size_type *)(in_RDI + 0x188) = sVar7;
  *(undefined8 *)(in_RDI + 400) = 0xffffffffffffffff;
  *(ulong *)(in_RDI + 0x198) = (ulong)in_stack_ffffffffffffffb1 << 8;
  return;
}

Assistant:

void set_logits(struct llama_context * ctx, int idx) {
        const auto * logits = llama_get_logits_ith(ctx, idx);

        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);

        const int n_vocab = llama_vocab_n_tokens(vocab);

        cur.resize(n_vocab);

        for (llama_token token_id = 0; token_id < n_vocab; token_id++) {
            cur[token_id] = llama_token_data{token_id, logits[token_id], 0.0f};
        }

        cur_p = { cur.data(), cur.size(), -1, false };
    }